

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsHasException(bool *hasException)

{
  ScriptContext *this;
  Recycler *this_00;
  ThreadContext *this_01;
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  JsrtContext *pJVar4;
  undefined4 *puVar5;
  
  if (hasException == (bool *)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else {
    *hasException = false;
    pJVar4 = JsrtContext::GetCurrent();
    if (pJVar4 == (JsrtContext *)0x0) {
      JVar3 = JsErrorNoCurrentContext;
    }
    else {
      this = (((pJVar4->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      if (this == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xc3e,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      this_00 = this->recycler;
      this_01 = this->threadContext;
      if (this_00 != (Recycler *)0x0) {
        if (this_00->objectBeforeCollectCallbackState != ObjectBeforeCollectCallback_None) {
          return JsErrorInObjectBeforeCollectCallback;
        }
        bVar2 = Memory::Recycler::IsHeapEnumInProgress(this_00);
        if (bVar2) {
          return JsErrorHeapEnumInProgress;
        }
      }
      JVar3 = JsErrorInThreadServiceCallback;
      if ((this_01->threadService).isInCallback == false) {
        bVar2 = ThreadContext::IsExecutionDisabled(this_01);
        JVar3 = JsErrorInDisabledState;
        if (!bVar2) {
          bVar2 = Js::ScriptContext::HasRecordedException(this);
          *hasException = bVar2;
          JVar3 = JsNoError;
        }
      }
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsHasException(_Out_ bool *hasException)
{
    PARAM_NOT_NULL(hasException);
    *hasException = false;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);
    Recycler *recycler = scriptContext->GetRecycler();
    ThreadContext *threadContext = scriptContext->GetThreadContext();

#ifndef JSRT_VERIFY_RUNTIME_STATE
    if (recycler && recycler->IsInObjectBeforeCollectCallback())
    {
        return JsErrorInObjectBeforeCollectCallback;
    }
#endif

    if (recycler && recycler->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (threadContext->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    *hasException = scriptContext->HasRecordedException();

    return JsNoError;
}